

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O0

unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> * __thiscall
pstack::Dwarf::Unit::getLines(Unit *this)

{
  Info *offset;
  bool bVar1;
  Tag TVar2;
  Unit *unit;
  undefined1 local_90 [16];
  Attribute attr;
  undefined1 local_48 [48];
  DIE *r;
  Unit *this_local;
  
  r = (DIE *)this;
  bVar1 = std::operator==(&this->lines,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    root((DIE *)local_48,this);
    local_48._40_8_ = (Section *)local_48;
    TVar2 = DIE::tag((DIE *)local_48);
    if ((TVar2 == DW_TAG_partial_unit) ||
       (TVar2 = DIE::tag((DIE *)local_48._40_8_), TVar2 == DW_TAG_compile_unit)) {
      DIE::attribute((Attribute *)(local_90 + 8),(DIE *)local_48._40_8_,DW_AT_stmt_list,false);
      bVar1 = DIE::Attribute::valid((Attribute *)(local_90 + 8));
      if (bVar1) {
        offset = this->dwarf;
        unit = (Unit *)DIE::Attribute::operator_cast_to_long((Attribute *)(local_90 + 8));
        Info::linesAt((Info *)local_90,(intmax_t)offset,unit);
        std::unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>::
        operator=(&this->lines,
                  (unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                   *)local_90);
        std::unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>::
        ~unique_ptr((unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                     *)local_90);
      }
      this_local = (Unit *)&this->lines;
      attr.formp._0_4_ = 1;
      DIE::Attribute::~Attribute((Attribute *)(local_90 + 8));
    }
    else {
      this_local = (Unit *)&this->lines;
      attr.formp._0_4_ = 1;
    }
    DIE::~DIE((DIE *)local_48);
  }
  else {
    this_local = (Unit *)&this->lines;
  }
  return (unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *)
         this_local;
}

Assistant:

const std::unique_ptr<LineInfo> &
Unit::getLines()
{
    if (lines != nullptr)
        return lines;

    const auto &r = root();
    if (r.tag() != DW_TAG_partial_unit && r.tag() != DW_TAG_compile_unit)
        return lines;

    auto attr = r.attribute(DW_AT_stmt_list);
    if (!attr.valid())
        return lines;

    lines = dwarf->linesAt(intmax_t(attr), *this);
    return lines;
}